

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int ltf8_put(char *cp,int64_t val)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  
  iVar7 = 1;
  if (0x7f < (ulong)val) {
    bVar1 = (byte)((ulong)val >> 8);
    if ((ulong)val < 0x4000) {
      *cp = bVar1 | 0x80;
      cp = cp + 1;
      iVar7 = 2;
    }
    else {
      bVar2 = (byte)((ulong)val >> 0x10);
      if ((ulong)val < 0x200000) {
        *cp = bVar2 | 0xc0;
        cp[1] = bVar1;
        cp = cp + 2;
        iVar7 = 3;
      }
      else {
        bVar3 = (byte)((ulong)val >> 0x18);
        if ((ulong)val < 0x10000000) {
          *cp = bVar3 | 0xe0;
          cp[1] = bVar2;
          cp[2] = bVar1;
          cp = cp + 3;
          iVar7 = 4;
        }
        else {
          bVar4 = (byte)((ulong)val >> 0x20);
          if ((ulong)val >> 0x23 == 0) {
            *cp = bVar4 | 0xf0;
            cp[1] = bVar3;
            cp[2] = bVar2;
            cp[3] = bVar1;
            cp = cp + 4;
            iVar7 = 5;
          }
          else {
            bVar5 = (byte)((ulong)val >> 0x28);
            if ((ulong)val >> 0x2a == 0) {
              *cp = bVar5 | 0xf8;
              cp[1] = bVar4;
              cp[2] = bVar3;
              cp[3] = bVar2;
              cp[4] = bVar1;
              cp = cp + 5;
              iVar7 = 6;
            }
            else {
              bVar6 = (byte)((ulong)val >> 0x30);
              if ((ulong)val >> 0x31 == 0) {
                *cp = bVar6 | 0xfc;
                cp[1] = bVar5;
                cp[2] = bVar4;
                cp[3] = bVar3;
                cp[4] = bVar2;
                cp[5] = bVar1;
                cp = cp + 6;
                iVar7 = 7;
              }
              else if ((ulong)val >> 0x38 == 0) {
                *cp = -2;
                cp[1] = bVar6;
                cp[2] = bVar5;
                cp[3] = bVar4;
                cp[4] = bVar3;
                cp[5] = bVar2;
                cp[6] = bVar1;
                cp = cp + 7;
                iVar7 = 8;
              }
              else {
                *cp = -1;
                cp[1] = (char)((ulong)val >> 0x38);
                cp[2] = bVar6;
                cp[3] = bVar5;
                cp[4] = bVar4;
                cp[5] = bVar3;
                cp[6] = bVar2;
                cp[7] = bVar1;
                cp = cp + 8;
                iVar7 = 9;
              }
            }
          }
        }
      }
    }
  }
  *cp = (char)val;
  return iVar7;
}

Assistant:

int ltf8_put(char *cp, int64_t val) {
    if        (!(val & ~((1LL<<7)-1))) {
	*cp = val;
	return 1;
    } else if (!(val & ~((1LL<<(6+8))-1))) {
	*cp++ = (val >> 8 ) | 0x80;
	*cp   = val & 0xff;
	return 2;
    } else if (!(val & ~((1LL<<(5+2*8))-1))) {
	*cp++ = (val >> 16) | 0xc0;
	*cp++ = (val >> 8 ) & 0xff;
	*cp   = val & 0xff;
	return 3;
    } else if (!(val & ~((1LL<<(4+3*8))-1))) {
	*cp++ = (val >> 24) | 0xe0;
	*cp++ = (val >> 16) & 0xff;
	*cp++ = (val >> 8 ) & 0xff;
	*cp   = val & 0xff;
	return 4;
    } else if (!(val & ~((1LL<<(3+4*8))-1))) {
	*cp++ = (val >> 32) | 0xf0;
	*cp++ = (val >> 24) & 0xff;
	*cp++ = (val >> 16) & 0xff;
	*cp++ = (val >> 8 ) & 0xff;
	*cp   = val & 0xff;
	return 5;
    } else if (!(val & ~((1LL<<(2+5*8))-1))) {
	*cp++ = (val >> 40) | 0xf8;
	*cp++ = (val >> 32) & 0xff;
	*cp++ = (val >> 24) & 0xff;
	*cp++ = (val >> 16) & 0xff;
	*cp++ = (val >> 8 ) & 0xff;
	*cp   = val & 0xff;
	return 6;
    } else if (!(val & ~((1LL<<(1+6*8))-1))) {
	*cp++ = (val >> 48) | 0xfc;
	*cp++ = (val >> 40) & 0xff;
	*cp++ = (val >> 32) & 0xff;
	*cp++ = (val >> 24) & 0xff;
	*cp++ = (val >> 16) & 0xff;
	*cp++ = (val >> 8 ) & 0xff;
	*cp   = val & 0xff;
	return 7;
    } else if (!(val & ~((1LL<<(7*8))-1))) {
	*cp++ = (val >> 56) | 0xfe;
	*cp++ = (val >> 48) & 0xff;
	*cp++ = (val >> 40) & 0xff;
	*cp++ = (val >> 32) & 0xff;
	*cp++ = (val >> 24) & 0xff;
	*cp++ = (val >> 16) & 0xff;
	*cp++ = (val >> 8 ) & 0xff;
	*cp   = val & 0xff;
	return 8;
    } else {
	*cp++ = 0xff;
	*cp++ = (val >> 56) & 0xff;
	*cp++ = (val >> 48) & 0xff;
	*cp++ = (val >> 40) & 0xff;
	*cp++ = (val >> 32) & 0xff;
	*cp++ = (val >> 24) & 0xff;
	*cp++ = (val >> 16) & 0xff;
	*cp++ = (val >> 8 ) & 0xff;
	*cp   = val & 0xff;
	return 9;
    }
}